

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser_exception.cpp
# Opt level: O3

char * __thiscall argo::json_parser_exception::get_main_message(json_parser_exception *this)

{
  uint uVar1;
  
  uVar1 = (this->super_json_exception).m_type - invalid_character_e;
  if (uVar1 < 7) {
    return (&PTR_anon_var_dwarf_53f92_00128bd0)[uVar1];
  }
  return "generic";
}

Assistant:

const char *json_parser_exception::get_main_message()
{
    switch (m_type)
    {
    case invalid_character_e:
        return "invalid character";
    case invalid_number_e:
        return "invalid number format";
    case number_out_of_range_e:
        return "number out of range";
    case number_too_long_e:
        return "number too long";
    case string_too_long_e:
        return "string too long";
    case unexpected_eof_e:
        return "unexpected end of file";
    case unexpected_token_e:
        return "unexpected token";
    default:
        return "generic";
    }

}